

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasNext(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *this)

{
  BacktrackData ***pppBVar1;
  BacktrackObject *pBVar2;
  BacktrackObject *pBVar3;
  char cVar4;
  bool bVar5;
  undefined1 uVar6;
  
  if (this->_normalizationRecording == true) {
    pppBVar1 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + -1;
    this->_normalizationRecording = false;
    pBVar3 = (this->_normalizationBacktrackData)._boList;
    while (pBVar3 != (BacktrackObject *)0x0) {
      (*pBVar3->_vptr_BacktrackObject[2])(pBVar3);
      pBVar2 = pBVar3->_next;
      (*pBVar3->_vptr_BacktrackObject[1])(pBVar3);
      pBVar3 = pBVar2;
    }
    (this->_normalizationBacktrackData)._boList = (BacktrackObject *)0x0;
  }
  do {
    if (((this->_leafData).super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>.
         _isSome == true) &&
       (cVar4 = (**(code **)(*(long *)(this->_leafData).
                                      super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>
                                      ._elem._elem + 0x10))(), cVar4 != '\0')) break;
    bVar5 = findNextLeaf(this);
  } while (bVar5);
  if ((this->_leafData).super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>._isSome
      != true) {
    return false;
  }
  uVar6 = (**(code **)(*(long *)(this->_leafData).
                                super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>.
                                _elem._elem + 0x10))();
  return (bool)uVar6;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }